

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_bz2.c
# Opt level: O0

void test_read_format_isorr_bz2(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  time_t tVar6;
  long v2;
  stat_conflict *psVar7;
  int local_3c;
  longlong lStack_38;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_259be;
  extract_reference_file("test_read_format_iso_rockridge.iso.Z");
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                   ,L'A',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'B',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'C',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename((archive_conflict *)p,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'E',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'J',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'L',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'M',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    iVar1 = strcmp(".",pcVar4);
    if (iVar1 == 0) {
      mVar3 = archive_entry_filetype((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Q',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar5 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'R',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
      tVar6 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'T',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'U',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar7 = archive_entry_stat((archive_entry_conflict *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'W',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      lVar5 = archive_entry_uid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'X',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
      iVar1 = archive_read_data_block
                        ((archive *)p,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Z',1,"ARCHIVE_EOF",(long)iVar1,
                          "archive_read_data_block(a, &p, &size, &offset)",p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'[',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
    }
    else {
      pcVar4 = archive_entry_pathname((archive_entry *)a);
      iVar1 = strcmp("dir",pcVar4);
      if (iVar1 == 0) {
        pcVar4 = archive_entry_pathname((archive_entry *)a);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                   ,L'^',"dir","\"dir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar3 = archive_entry_filetype((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'_',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar5 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'`',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
        tVar6 = archive_entry_mtime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'a',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
        tVar6 = archive_entry_atime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'b',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0);
        psVar7 = archive_entry_stat((archive_entry_conflict *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'c',2,"2",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        lVar5 = archive_entry_uid((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'd',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
        lVar5 = archive_entry_gid((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'e',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)a);
        iVar1 = strcmp("file",pcVar4);
        if (iVar1 == 0) {
          pcVar4 = archive_entry_pathname((archive_entry *)a);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                     ,L'h',"file","\"file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          mVar3 = archive_entry_filetype((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'i',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar5 = archive_entry_size((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'j',0xbc6154,"12345684",lVar5,"archive_entry_size(ae)",(void *)0x0);
          iVar1 = archive_read_data_block
                            ((archive *)p,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8)
          ;
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'l',0,"0",(long)iVar1,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'm',0,"0",lStack_38,"offset",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'n',(void *)size,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
          tVar6 = archive_entry_mtime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'o',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
          tVar6 = archive_entry_atime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'p',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0);
          psVar7 = archive_entry_stat((archive_entry_conflict *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'q',2,"2",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                              (void *)0x0);
          lVar5 = archive_entry_uid((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'r',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
          lVar5 = archive_entry_gid((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L's',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)a);
          iVar1 = strcmp("hardlink",pcVar4);
          if (iVar1 == 0) {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                       ,L'{',"hardlink","\"hardlink\"",pcVar4,"archive_entry_pathname(ae)",
                       (void *)0x0,L'\0');
            mVar3 = archive_entry_filetype((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'|',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                                (void *)0x0);
            pcVar4 = archive_entry_hardlink((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                       ,L'}',"file","\"file\"",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0'
                      );
            wVar2 = archive_entry_size_is_set((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'~',0,"0",(long)wVar2,"archive_entry_size_is_set(ae)",(void *)0x0)
            ;
            lVar5 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x7f',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
            tVar6 = archive_entry_mtime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x80',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0
                               );
            tVar6 = archive_entry_atime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x81',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0
                               );
            psVar7 = archive_entry_stat((archive_entry_conflict *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x82',2,"2",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                (void *)0x0);
            lVar5 = archive_entry_uid((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x83',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
            lVar5 = archive_entry_gid((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x84',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            iVar1 = strcmp("symlink",pcVar4);
            if (iVar1 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x87',0xa000,"AE_IFLNK",(ulong)mVar3,
                                  "archive_entry_filetype(ae)",(void *)0x0);
              pcVar4 = archive_entry_symlink((archive_entry *)a);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                         ,L'\x88',"file","\"file\"",pcVar4,"archive_entry_symlink(ae)",(void *)0x0,
                         L'\0');
              lVar5 = archive_entry_size((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x89',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
              tVar6 = archive_entry_mtime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8a',0x2a302,"172802",tVar6,"archive_entry_mtime(ae)",
                                  (void *)0x0);
              tVar6 = archive_entry_atime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8b',0x2a302,"172802",tVar6,"archive_entry_atime(ae)",
                                  (void *)0x0);
              psVar7 = archive_entry_stat((archive_entry_conflict *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8c',1,"1",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink"
                                  ,(void *)0x0);
              lVar5 = archive_entry_uid((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8d',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
              lVar5 = archive_entry_gid((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8e',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
            }
            else {
              pcVar4 = archive_entry_pathname((archive_entry *)a);
              iVar1 = strcmp("symlink2",pcVar4);
              if (iVar1 == 0) {
                mVar3 = archive_entry_filetype((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x91',0xa000,"AE_IFLNK",(ulong)mVar3,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                pcVar4 = archive_entry_symlink((archive_entry *)a);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                           ,L'\x92',"/tmp","\"/tmp\"",pcVar4,"archive_entry_symlink(ae)",(void *)0x0
                           ,L'\0');
                lVar5 = archive_entry_size((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x93',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
                psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x94',1,"1",psVar7->st_nlink,
                                    "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                lVar5 = archive_entry_uid((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x95',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                lVar5 = archive_entry_gid((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x96',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
              }
              else {
                pcVar4 = archive_entry_pathname((archive_entry *)a);
                iVar1 = strcmp("symlink3",pcVar4);
                if (iVar1 == 0) {
                  mVar3 = archive_entry_filetype((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x99',0xa000,"AE_IFLNK",(ulong)mVar3,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  pcVar4 = archive_entry_symlink((archive_entry *)a);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                             ,L'\x9a',"/tmp/..","\"/tmp/..\"",pcVar4,"archive_entry_symlink(ae)",
                             (void *)0x0,L'\0');
                  lVar5 = archive_entry_size((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9b',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
                  psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9c',1,"1",psVar7->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  lVar5 = archive_entry_uid((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9d',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                  lVar5 = archive_entry_gid((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9e',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                }
                else {
                  pcVar4 = archive_entry_pathname((archive_entry *)a);
                  iVar1 = strcmp("symlink4",pcVar4);
                  if (iVar1 == 0) {
                    mVar3 = archive_entry_filetype((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¡',0xa000,"AE_IFLNK",(ulong)mVar3,
                                        "archive_entry_filetype(ae)",(void *)0x0);
                    pcVar4 = archive_entry_symlink((archive_entry *)a);
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                               ,L'£',".././../tmp","\".././../tmp\"",pcVar4,
                               "archive_entry_symlink(ae)",(void *)0x0,L'\0');
                    lVar5 = archive_entry_size((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¤',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
                    psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¥',1,"1",psVar7->st_nlink,
                                        "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                    lVar5 = archive_entry_uid((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¦',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                    lVar5 = archive_entry_gid((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'§',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                  }
                  else {
                    pcVar4 = archive_entry_pathname((archive_entry *)a);
                    iVar1 = strcmp("symlink5",pcVar4);
                    if (iVar1 == 0) {
                      mVar3 = archive_entry_filetype((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'ª',0xa000,"AE_IFLNK",(ulong)mVar3,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      pcVar4 = archive_entry_symlink((archive_entry *)a);
                      assertion_equal_string
                                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                 ,L'«',".///file","\".///file\"",pcVar4,"archive_entry_symlink(ae)"
                                 ,(void *)0x0,L'\0');
                      lVar5 = archive_entry_size((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¬',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
                      tVar6 = archive_entry_mtime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'­',0x2a302,"172802",tVar6,"archive_entry_mtime(ae)",
                                          (void *)0x0);
                      tVar6 = archive_entry_atime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'®',0x2a302,"172802",tVar6,"archive_entry_atime(ae)",
                                          (void *)0x0);
                      psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¯',1,"1",psVar7->st_nlink,
                                          "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                      lVar5 = archive_entry_uid((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'°',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                      lVar5 = archive_entry_gid((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'±',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                    }
                    else {
                      pcVar4 = archive_entry_pathname((archive_entry *)a);
                      iVar1 = strcmp("symlink6",pcVar4);
                      if (iVar1 == 0) {
                        mVar3 = archive_entry_filetype((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                            ,L'µ',0xa000,"AE_IFLNK",(ulong)mVar3,
                                            "archive_entry_filetype(ae)",(void *)0x0);
                        pcVar4 = archive_entry_symlink((archive_entry *)a);
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                   ,L'¶',"/tmp//..","\"/tmp//..\"",pcVar4,
                                   "archive_entry_symlink(ae)",(void *)0x0,L'\0');
                        lVar5 = archive_entry_size((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                            ,L'·',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0)
                        ;
                        psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                            ,L'¸',1,"1",psVar7->st_nlink,
                                            "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                        lVar5 = archive_entry_uid((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                            ,L'¹',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                        lVar5 = archive_entry_gid((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                            ,L'º',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                      }
                      else {
                        failure("Saw a file that shouldn\'t have been there");
                        pcVar4 = archive_entry_pathname((archive_entry *)a);
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                   ,L'½',pcVar4,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,
                                   L'\0');
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'Â',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code((archive *)p,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'Å',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'Æ',(long)iVar1,"archive_format(a)",0x40001,
                      "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
  iVar1 = archive_read_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isorr_bz2)
{
	const char *refname = "test_read_format_iso_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 10; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));
		
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */ 
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */ 
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("hardlink", archive_entry_pathname(ae)) == 0) {
			/* A hardlink to the regular file. */
			/* Note: If "hardlink" gets returned before "file",
			 * then "hardlink" will get returned as a regular file
			 * and "file" will get returned as the hardlink.
			 * This test should tolerate that, since it's a
			 * perfectly permissible thing for libarchive to do. */
			assertEqualString("hardlink", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_hardlink(ae));
			assertEqualInt(0, archive_entry_size_is_set(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink2", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp (an absolute path) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink3", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp/.. (with a ".." component) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp/..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink4", archive_entry_pathname(ae)) == 0) {
			/* A symlink to a path with ".." and "." components */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".././../tmp",
			    archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink5", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file with "/" components. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".///file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink6", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp//..
			 * (with "/" and ".." components) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp//..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}